

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O1

void __thiscall Raytracer::Image::Save(Image *this,string *name)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ofstream file;
  char local_231;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((string *)&local_230);
  std::ofstream::open((string *)&local_230,(_Ios_Openmode)name);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"P6\n",3);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&local_230,this->width);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->height);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n255\n",5);
  if (0 < this->height) {
    lVar3 = 0;
    do {
      if (0 < this->width) {
        lVar4 = 0;
        lVar2 = 0;
        do {
          local_231 = (char)(int)*(float *)((long)&this->datas[lVar3]->r + lVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,&local_231,1);
          local_231 = (char)(int)*(float *)((long)&this->datas[lVar3]->g + lVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,&local_231,1);
          local_231 = (char)(int)*(float *)((long)&this->datas[lVar3]->b + lVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,&local_231,1);
          lVar2 = lVar2 + 1;
          lVar4 = lVar4 + 0xc;
        } while (lVar2 < this->width);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < this->height);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Raytracer::Image::Save(std::string name) {
    std::ofstream file;
    file.open(name, std::ofstream::out | std::ofstream::binary);
    file << "P6\n" << width << " " << height << "\n255\n";
    for(int y = 0;y<height;y++){
        for(int x = 0;x<width;x++){
              file << (char)datas[y][x].r;
              file << (char)datas[y][x].g;
              file << (char)datas[y][x].b;

        }
    }
    file.close();
}